

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall Js::JSONStringifier::ReadSpace(JSONStringifier *this,Var space)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  int *b;
  charcount_t *pcVar5;
  JavascriptString *pJVar6;
  double dVar7;
  charcount_t local_5c;
  double numericSpace;
  int local_38 [2];
  Var local_30;
  Var space_local;
  JSONStringifier *this_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  if (space != (Var)0x0) {
    local_30 = space;
    space_local = this;
    this_local = (JSONStringifier *)space;
    if (space == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TaggedInt::Is(this_local);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(this_local);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(this_local);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if ((0x57 < (int)local_14) && (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_18 = local_14;
      }
    }
    switch(local_18) {
    case TypeIds_FirstNumberType:
      local_38[1] = 0;
      local_38[0] = 10;
      numericSpace._4_4_ = TaggedInt::ToInt32(local_30);
      b = min<int>(local_38,(int *)((long)&numericSpace + 4));
      pcVar5 = (charcount_t *)max<int>(local_38 + 1,b);
      SetNumericGap(this,*pcVar5);
      break;
    case TypeIds_Number:
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
    case TypeIds_NumberObject:
      dVar7 = JavascriptConversion::ToInteger(local_30,this->scriptContext);
      if (0.0 < dVar7) {
        if (10.0 <= dVar7) {
          local_5c = 10;
        }
        else {
          local_5c = (charcount_t)(long)dVar7;
        }
        SetNumericGap(this,local_5c);
      }
      break;
    case TypeIds_String:
      pJVar6 = UnsafeVarTo<Js::JavascriptString>(local_30);
      SetStringGap(this,pJVar6);
      break;
    default:
      break;
    case TypeIds_StringObject:
      pJVar6 = JavascriptConversion::ToString(local_30,this->scriptContext);
      SetStringGap(this,pJVar6);
    }
  }
  return;
}

Assistant:

void
JSONStringifier::ReadSpace(_In_opt_ Var space)
{
    if (space != nullptr)
    {
        switch (JavascriptOperators::GetTypeId(space))
        {
        case TypeIds_Integer:
            this->SetNumericGap(static_cast<charcount_t>(max(0, min(static_cast<int>(MaxGapLength), TaggedInt::ToInt32(space)))));

            break;
        case TypeIds_Number:
        case TypeIds_NumberObject:
        case TypeIds_Int64Number:
        case TypeIds_UInt64Number:
        {
            double numericSpace = JavascriptConversion::ToInteger(space, this->scriptContext);
            if (numericSpace > 0)
            {
                SetNumericGap(numericSpace < static_cast<double>(MaxGapLength) ? static_cast<charcount_t>(numericSpace) : MaxGapLength);
            }
            break;
        }
        case TypeIds_String:
            this->SetStringGap(UnsafeVarTo<JavascriptString>(space));
            break;
        case TypeIds_StringObject:
            this->SetStringGap(JavascriptConversion::ToString(space, this->scriptContext));
            break;
        default:
            break;
        }
    }
}